

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::AggressiveDCEPass::ProcessWorkList(AggressiveDCEPass *this,Function *func)

{
  _Elt_pointer ppIVar1;
  Instruction *inst;
  
  while (ppIVar1 = (this->worklist_).c.
                   super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur,
        (this->worklist_).c.
        super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppIVar1) {
    inst = *ppIVar1;
    std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    pop_front(&(this->worklist_).c);
    AddOperandsToWorkList(this,inst);
    MarkBlockAsLive(this,inst);
    MarkLoadedVariablesAsLive(this,func,inst);
    AddDecorationsToWorkList(this,inst);
    AddDebugInstructionsToWorkList(this,inst);
  }
  return;
}

Assistant:

void AggressiveDCEPass::ProcessWorkList(Function* func) {
  while (!worklist_.empty()) {
    Instruction* live_inst = worklist_.front();
    worklist_.pop();
    AddOperandsToWorkList(live_inst);
    MarkBlockAsLive(live_inst);
    MarkLoadedVariablesAsLive(func, live_inst);
    AddDecorationsToWorkList(live_inst);
    AddDebugInstructionsToWorkList(live_inst);
  }
}